

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.cpp
# Opt level: O2

void * RoboteqThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  int local_c48;
  int local_c44;
  CHRONO chrono_period;
  char szTemp [256];
  ROBOTEQ roboteq;
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  
  iVar11 = (int)pParam;
  sprintf(szCfgFilePath,"Roboteq%d.txt",(ulong)pParam & 0xffffffff);
  memset(&roboteq,0,0x8b0);
  StartChrono(&chrono_period);
  local_c48 = 100;
  bVar2 = false;
  local_c44 = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)local_c48);
      if (bPauseRoboteq[iVar11] == 0) break;
      if (!bVar2) {
        puts("Roboteq paused.");
        DisconnectRoboteq(&roboteq);
      }
      if (bExit != 0) goto LAB_00178dad;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartRoboteq[iVar11] == 0) {
      if (bVar2) goto LAB_00178a2f;
      if ((((robid == 0x1000) || (robid == 0x2000)) || (robid == 0x4000)) ||
         (((robid == 0x8000 || (robid == 0x200000)) || (robid == 0x100000)))) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        dVar6 = uw_f;
        dVar5 = u_f;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        iVar7 = Set2ActuatorsRoboteq(&roboteq,dVar6,dVar5);
      }
      else {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        dVar6 = u2;
        dVar5 = u1;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        iVar7 = SetThrustersRoboteq(&roboteq,dVar5,dVar6);
      }
      if (iVar7 == 0) goto LAB_00178d40;
      puts("Connection to a Roboteq lost.");
      DisconnectRoboteq(&roboteq);
LAB_00178a52:
      local_c44 = local_c44 + 1;
      if (ExitOnErrorCount <= local_c44 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_00178dad:
        bVar3 = true;
        goto LAB_00178db3;
      }
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a Roboteq.");
        DisconnectRoboteq(&roboteq);
      }
      bRestartRoboteq[iVar11] = 0;
LAB_00178a2f:
      iVar7 = ConnectRoboteq(&roboteq,szCfgFilePath);
      if (iVar7 != 0) {
        mSleep(1000);
        goto LAB_00178a52;
      }
      local_c48 = roboteq.threadperiod;
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      ibat1_filtered = 0.0;
      vbat1_filtered = 0.0;
      if ((long)roboteq.vbat1analoginputchan != -1) {
        vbat1_filtered = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan];
      }
      if ((long)roboteq.ibat1analoginputchan != -1) {
        ibat1_filtered = roboteq.analoginputthreshold[roboteq.ibat1analoginputchan];
      }
      ibat2_filtered = 0.0;
      vbat2_filtered = 0.0;
      if ((long)roboteq.vbat2analoginputchan != -1) {
        vbat2_filtered = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan];
      }
      if ((long)roboteq.ibat2analoginputchan != -1) {
        ibat2_filtered = roboteq.analoginputthreshold[roboteq.ibat2analoginputchan];
      }
      vswitchthreshold = roboteq.analoginputthreshold[roboteq.switchanaloginputchan];
      vswitchcoef = roboteq.analoginputcoef[roboteq.switchanaloginputchan];
      vbat1_threshold = vbat1_filtered;
      vbat2_threshold = vbat2_filtered;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      if (roboteq.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)roboteq.pfSaveFile);
        roboteq.pfSaveFile = (FILE *)0x0;
      }
      if (roboteq.bSaveRawData != 0) {
        if (roboteq.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"Roboteq",8);
        }
        else {
          sprintf(szTemp,"%.127s",roboteq.szCfgFilePath);
        }
        sVar8 = strlen(szTemp);
        iVar7 = (int)sVar8 + 1;
        uVar10 = sVar8 & 0xffffffff;
        do {
          if ((int)uVar10 < 1) goto LAB_00178cdf;
          uVar1 = uVar10 - 1;
          iVar7 = iVar7 + -1;
          lVar4 = uVar10 - 1;
          uVar10 = uVar1;
        } while (szTemp[lVar4] != '.');
        if ((uVar1 != 0) && (iVar7 <= (int)sVar8)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar8 - (uVar1 & 0xffffffff));
        }
LAB_00178cdf:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar9 = strtimeex_fns();
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar9);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        roboteq.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
        if ((FILE *)roboteq.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create Roboteq data file.");
          bVar3 = false;
          goto LAB_00178db3;
        }
      }
LAB_00178d40:
      bVar3 = false;
      bVar2 = true;
    }
    if (bExit != 0) {
LAB_00178db3:
      SetThrustersRoboteq(&roboteq,0.0,0.0);
      mSleep((long)local_c48);
      StopChronoQuick(&chrono_period);
      if (roboteq.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)roboteq.pfSaveFile);
        roboteq.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectRoboteq(&roboteq);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RoboteqThread(void* pParam)
{
	ROBOTEQ roboteq;
	double rudder = 0, thrust = 0, thrust1 = 0, thrust2 = 0;
	//int counter = 0, counter_modulo = 0;
	int res = EXIT_SUCCESS;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "Roboteq%d.txt", deviceid);

	memset(&roboteq, 0, sizeof(ROBOTEQ));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Roboteq paused.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a Roboteq.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			bRestartRoboteq[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRoboteq(&roboteq, szCfgFilePath) == EXIT_SUCCESS)
			{
				bConnected = TRUE;
				threadperiod = roboteq.threadperiod;

				EnterCriticalSection(&StateVariablesCS);

				if (roboteq.vbat1analoginputchan != -1) vbat1_filtered = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_filtered = 0;
				if (roboteq.vbat1analoginputchan != -1) vbat1_threshold = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_threshold = 0;
				if (roboteq.ibat1analoginputchan != -1) ibat1_filtered = roboteq.analoginputthreshold[roboteq.ibat1analoginputchan]; else ibat1_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_filtered = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_threshold = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_threshold = 0;
				if (roboteq.ibat2analoginputchan != -1) ibat2_filtered = roboteq.analoginputthreshold[roboteq.ibat2analoginputchan]; else ibat2_filtered = 0;
				vswitchcoef = roboteq.analoginputcoef[roboteq.switchanaloginputchan];
				vswitchthreshold = roboteq.analoginputthreshold[roboteq.switchanaloginputchan];

				LeaveCriticalSection(&StateVariablesCS);

				if (roboteq.pfSaveFile != NULL)
				{
					fclose(roboteq.pfSaveFile);
					roboteq.pfSaveFile = NULL;
				}
				if ((roboteq.bSaveRawData)&&(roboteq.pfSaveFile == NULL))
				{
					if (strlen(roboteq.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", roboteq.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "Roboteq");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					roboteq.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (roboteq.pfSaveFile == NULL)
					{
						printf("Unable to create Roboteq data file.\n");
						break;
					}
				}
			}
			else
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			res = EXIT_SUCCESS;

			switch (robid)
			{
			case BUGGY_SIMULATOR_ROBID:
			case BUGGY_ROBID:
			case SAILBOAT_SIMULATOR_ROBID:
			case VAIMOS_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudder = uw_f;
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				res = Set2ActuatorsRoboteq(&roboteq, rudder, thrust);
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				res = SetThrustersRoboteq(&roboteq, thrust1, thrust2);
				break;
			}

			if (res != EXIT_SUCCESS)
			{
				printf("Connection to a Roboteq lost.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
		}

		//printf("RoboteqThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersRoboteq(&roboteq, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (roboteq.pfSaveFile != NULL)
	{
		fclose(roboteq.pfSaveFile);
		roboteq.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRoboteq(&roboteq);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}